

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunningTest::addSection(RunningTest *this,string *name)

{
  bool bVar1;
  RunningSection *this_00;
  RunningTest *in_RDI;
  RunningSection *thisSection;
  bool *in_stack_00000038;
  string *in_stack_00000040;
  RunningSection *in_stack_00000048;
  bool local_1;
  
  if (in_RDI->m_runStatus == NothingRun) {
    in_RDI->m_runStatus = EncounteredASection;
  }
  this_00 = RunningSection::findOrAddSubSection
                      (in_stack_00000048,in_stack_00000040,in_stack_00000038);
  bVar1 = wasSectionSeen(in_RDI);
  if ((bVar1) || (bVar1 = RunningSection::shouldRun(this_00), !bVar1)) {
    local_1 = false;
  }
  else {
    in_RDI->m_currentSection = this_00;
    in_RDI->m_lastSectionToRun = (RunningSection *)0x0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool addSection( std::string const& name ) {
            if( m_runStatus == NothingRun )
                m_runStatus = EncounteredASection;

            RunningSection* thisSection = m_currentSection->findOrAddSubSection( name, m_changed );

            if( !wasSectionSeen() && thisSection->shouldRun() ) {
                m_currentSection = thisSection;
                m_lastSectionToRun = NULL;
                return true;
            }
            return false;
        }